

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<double>(double *x,size_t n,MissingAction missing_action,double *xmin,double *xmax,
                      bool *unsplittable)

{
  double dVar1;
  bool bVar2;
  size_t row_1;
  size_t row;
  size_t sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar6;
  double __x;
  undefined1 local_68 [16];
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  if (missing_action == Fail) {
    __x = -INFINITY;
    local_68._0_8_ = INFINITY;
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      dVar1 = x[sVar3];
      uVar4 = SUB84(dVar1,0);
      uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar6 = dVar1;
      if ((double)local_68._0_8_ <= dVar1) {
        dVar6 = (double)local_68._0_8_;
      }
      *xmin = dVar6;
      if (dVar1 <= __x) {
        uVar4 = SUB84(__x,0);
        uVar5 = (undefined4)((ulong)__x >> 0x20);
      }
      *xmax = (double)CONCAT44(uVar5,uVar4);
      __x = (double)CONCAT44(uVar5,uVar4);
      local_68._0_8_ = dVar6;
    }
  }
  else {
    local_68 = ZEXT816(0x7ff0000000000000);
    __x = -INFINITY;
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      dVar1 = x[sVar3];
      dVar6 = fmin((double)local_68._0_8_,dVar1);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar6;
      local_68._12_4_ = extraout_XMM0_Dd;
      *xmin = dVar6;
      __x = fmax(__x,dVar1);
      *xmax = __x;
    }
  }
  bVar2 = true;
  if ((((double)local_68._0_8_ != __x) || (NAN((double)local_68._0_8_) || NAN(__x))) &&
     ((double)local_68._0_8_ != INFINITY || __x != -INFINITY)) {
    bVar2 = NAN(__x);
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(real_t *restrict x, size_t n,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = (x[row] < xmin)? x[row] : xmin;
            xmax = (x[row] > xmax)? x[row] : xmax;
        }
    }


    else
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = std::fmin(xmin, x[row]);
            xmax = std::fmax(xmax, x[row]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}